

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_enc.c
# Opt level: O0

int GetILevel(int sharpness,int level)

{
  int level_local;
  int sharpness_local;
  
  level_local = level;
  if (0 < sharpness) {
    if (sharpness < 5) {
      level_local = level >> 1;
    }
    else {
      level_local = level >> 2;
    }
    if (9 - sharpness < level_local) {
      level_local = 9 - sharpness;
    }
  }
  if (level_local < 1) {
    level_local = 1;
  }
  return level_local;
}

Assistant:

static int GetILevel(int sharpness, int level) {
  if (sharpness > 0) {
    if (sharpness > 4) {
      level >>= 2;
    } else {
      level >>= 1;
    }
    if (level > 9 - sharpness) {
      level = 9 - sharpness;
    }
  }
  if (level < 1) level = 1;
  return level;
}